

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_long_long unaff_R12;
  unsigned_long_long uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  ZSTD_frameSizeInfo ZVar7;
  ZSTD_frameHeader local_58;
  
  if (srcSize < 5) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        uVar1 = 0xffffffffffffffb8;
        if (7 < srcSize) {
          uVar1 = 0xfffffffffffffff2;
          if ((*(uint *)((long)src + 4) >> 3 < 0x1fffffff) &&
             (uVar1 = (ulong)*(uint *)((long)src + 4) + 8, srcSize < uVar1)) {
            uVar1 = 0xffffffffffffffb8;
          }
        }
        if (uVar1 < 0xffffffffffffff89) {
          src = (void *)((long)src + uVar1);
          srcSize = srcSize - uVar1;
          bVar5 = false;
        }
        else {
          unaff_R12 = 0xfffffffffffffffe;
          bVar5 = true;
        }
      }
      else {
        bVar6 = false;
        sVar2 = ZSTD_getFrameHeader_advanced(&local_58,src,srcSize,ZSTD_f_zstd1);
        uVar1 = local_58.frameContentSize;
        if (local_58.frameType == ZSTD_skippableFrame) {
          uVar1 = 0;
        }
        if (sVar2 != 0) {
          uVar1 = 0xfffffffffffffffe;
        }
        if (uVar1 < 0xfffffffffffffffe) {
          uVar1 = uVar1 + uVar4;
          bVar6 = uVar4 <= uVar1;
          if (uVar4 < uVar1) {
            uVar4 = uVar1;
          }
          uVar1 = unaff_R12;
          if (!bVar6) {
            uVar1 = 0xfffffffffffffffe;
          }
        }
        unaff_R12 = uVar1;
        bVar5 = true;
        if (bVar6) {
          ZVar7 = ZSTD_findFrameSizeInfo(src,srcSize);
          uVar1 = ZVar7.compressedSize;
          if (uVar1 < 0xffffffffffffff89) {
            src = (void *)((long)src + uVar1);
            srcSize = srcSize - uVar1;
            bVar5 = false;
          }
          else {
            unaff_R12 = 0xfffffffffffffffe;
          }
        }
      }
      if (bVar5) {
        return unaff_R12;
      }
    } while (4 < srcSize);
  }
  uVar3 = 0xfffffffffffffffe;
  if (srcSize == 0) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_FRAMEHEADERSIZE_PREFIX) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t const skippableSize = readSkippableFrameSize(src, srcSize);
            if (ZSTD_isError(skippableSize)) {
                return ZSTD_CONTENTSIZE_ERROR;
            }
            assert(skippableSize <= srcSize);

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const ret = ZSTD_getFrameContentSize(src, srcSize);
            if (ret >= ZSTD_CONTENTSIZE_ERROR) return ret;

            /* check for overflow */
            if (totalDstSize + ret < totalDstSize) return ZSTD_CONTENTSIZE_ERROR;
            totalDstSize += ret;
        }
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) {
                return ZSTD_CONTENTSIZE_ERROR;
            }

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}